

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::DecimalQuantity::operator==(DecimalQuantity *this,DecimalQuantity *other)

{
  int iVar1;
  int iVar2;
  int8_t iVar3;
  int8_t iVar4;
  int32_t magnitude;
  bool bVar5;
  int iVar6;
  
  iVar1 = this->scale;
  if (((((iVar1 == other->scale) && (this->precision == other->precision)) &&
       (this->flags == other->flags)) &&
      ((this->lOptPos == other->lOptPos && (this->lReqPos == other->lReqPos)))) &&
     ((iVar2 = this->rReqPos, iVar2 == other->rReqPos &&
      ((iVar6 = this->rOptPos, iVar6 == other->rOptPos &&
       (this->isApproximate == other->isApproximate)))))) {
    if (this->precision == 0) {
      bVar5 = true;
    }
    else if (this->isApproximate == '\0') {
      magnitude = getUpperDisplayMagnitude(this);
      if (iVar6 <= iVar1) {
        iVar6 = iVar1;
      }
      if (iVar2 < iVar1) {
        iVar6 = iVar2;
      }
      do {
        bVar5 = magnitude < iVar6;
        if (magnitude < iVar6) {
          return bVar5;
        }
        iVar3 = getDigit(this,magnitude);
        iVar4 = getDigit(other,magnitude);
        magnitude = magnitude + -1;
      } while (iVar3 == iVar4);
    }
    else {
      bVar5 = this->origDelta == other->origDelta && this->origDouble == other->origDouble;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool DecimalQuantity::operator==(const DecimalQuantity& other) const {
    bool basicEquals =
            scale == other.scale
            && precision == other.precision
            && flags == other.flags
            && lOptPos == other.lOptPos
            && lReqPos == other.lReqPos
            && rReqPos == other.rReqPos
            && rOptPos == other.rOptPos
            && isApproximate == other.isApproximate;
    if (!basicEquals) {
        return false;
    }

    if (precision == 0) {
        return true;
    } else if (isApproximate) {
        return origDouble == other.origDouble && origDelta == other.origDelta;
    } else {
        for (int m = getUpperDisplayMagnitude(); m >= getLowerDisplayMagnitude(); m--) {
            if (getDigit(m) != other.getDigit(m)) {
                return false;
            }
        }
        return true;
    }
}